

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

Move * cuddZddSymmSifting_up(DdManager *table,int x,int x_low,int initial_size)

{
  uint x_00;
  Move *pMVar1;
  int iVar2;
  DdNode *pDVar3;
  uint local_48;
  int gytop;
  int i;
  int limit_size;
  int size;
  int y;
  Move *move;
  Move *moves;
  int local_20;
  int initial_size_local;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  moves._4_4_ = initial_size;
  local_20 = x_low;
  initial_size_local = x;
  _x_low_local = table;
  limit_size = cuddZddNextLow(table,x);
  gytop = initial_size;
  do {
    if (limit_size < local_20) {
      return move;
    }
    x_00 = _x_low_local->subtableZ[limit_size].next;
    iVar2 = cuddZddSymmCheck(_x_low_local,limit_size,initial_size_local);
    if (iVar2 == 0) {
      if ((_x_low_local->subtableZ[initial_size_local].next == initial_size_local) &&
         (_x_low_local->subtableZ[limit_size].next == limit_size)) {
        iVar2 = cuddZddSwapInPlace(_x_low_local,limit_size,initial_size_local);
        if ((iVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(_x_low_local), pDVar3 == (DdNode *)0x0))
        {
          while (move != (Move *)0x0) {
            pMVar1 = move->next;
            move->y = 0;
            *(DdNode **)&move->flags = _x_low_local->nextFree;
            _x_low_local->nextFree = (DdNode *)move;
            move = pMVar1;
          }
          return (Move *)0x1;
        }
        pDVar3->index = limit_size;
        pDVar3->ref = initial_size_local;
        *(int *)((long)&pDVar3->next + 4) = iVar2;
        (pDVar3->type).kids.T = (DdNode *)move;
        if ((double)gytop * _x_low_local->maxGrowth < (double)iVar2) {
          return (Move *)pDVar3;
        }
        move = (Move *)pDVar3;
        if (iVar2 < gytop) {
          gytop = iVar2;
        }
      }
      else {
        iVar2 = zdd_group_move(_x_low_local,limit_size,initial_size_local,&move);
        if ((double)gytop * _x_low_local->maxGrowth < (double)iVar2) {
          return move;
        }
        if (iVar2 < gytop) {
          gytop = iVar2;
        }
      }
    }
    else {
      _x_low_local->subtableZ[limit_size].next = initial_size_local;
      local_48 = _x_low_local->subtableZ[initial_size_local].next;
      while (_x_low_local->subtableZ[(int)local_48].next != initial_size_local) {
        local_48 = _x_low_local->subtableZ[(int)local_48].next;
      }
      _x_low_local->subtableZ[(int)local_48].next = x_00;
    }
    initial_size_local = x_00;
    limit_size = cuddZddNextLow(_x_low_local,x_00);
  } while( true );
}

Assistant:

static Move *
cuddZddSymmSifting_up(
  DdManager * table,
  int  x,
  int  x_low,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;
    int         i, gytop;

    moves = NULL;
    y = cuddZddNextLow(table, x);
    while (y >= x_low) {
        gytop = table->subtableZ[y].next;
        if (cuddZddSymmCheck(table, y, x)) {
            /* Symmetry found, attach symm groups */
            table->subtableZ[y].next = x;
            i = table->subtableZ[x].next;
            while (table->subtableZ[i].next != (unsigned) x)
                i = table->subtableZ[i].next;
            table->subtableZ[i].next = gytop;
        }
        else if ((table->subtableZ[x].next == (unsigned) x) &&
            (table->subtableZ[y].next == (unsigned) y)) {
            /* x and y have self symmetry */
            size = cuddZddSwapInPlace(table, y, x);
            if (size == 0)
                goto cuddZddSymmSifting_upOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto cuddZddSymmSifting_upOutOfMem;
            move->x = y;
            move->y = x;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        else { /* Group move */
            size = zdd_group_move(table, y, x, &moves);
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        x = gytop;
        y = cuddZddNextLow(table, x);
    }

    return(moves);

cuddZddSymmSifting_upOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(ZDD_MV_OOM);

}